

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  undefined1 *in_RSI;
  long *in_RDI;
  bool bVar6;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int num_zeros_1;
  int num_zeros;
  int full_exp;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  char cVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *local_18;
  char *local_8;
  
  iVar5 = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    *in_RSI = *(undefined1 *)*in_RDI;
    lVar1 = in_RDI[3];
    lVar2 = in_RDI[1];
    if ((1 < (int)in_RDI[1]) || ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
      in_RSI[1] = (char)in_RDI[4];
    }
    local_18 = copy_str<char,_const_char_*,_char_*,_0>
                         ((char *)in_RDI,
                          (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                           CONCAT16(in_stack_ffffffffffffffae,
                                                    CONCAT15(in_stack_ffffffffffffffad,
                                                             CONCAT14(in_stack_ffffffffffffffac,
                                                                      in_stack_ffffffffffffffa8)))),
                          (char *)0x1560cf);
    if ((0 < (int)lVar1 - (int)lVar2) && ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
      local_18 = std::fill_n<char*,int,char>
                           ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc,
                            (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    cVar7 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x10000) == 0) {
      cVar7 = 'e';
    }
    *local_18 = cVar7;
    local_8 = write_exponent<char,char*>(iVar5 + -1,local_18 + 1);
  }
  else {
    if (iVar5 < (int)in_RDI[1]) {
      if (iVar5 < 1) {
        *in_RSI = 0x30;
        iVar5 = -iVar5;
        iVar3 = (int)in_RDI[1];
        if (((iVar3 == 0) && (-1 < (int)in_RDI[3])) && ((int)in_RDI[3] < iVar5)) {
          iVar5 = (int)in_RDI[3];
        }
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          while( true ) {
            bVar6 = false;
            if (0 < iVar3) {
              bVar6 = *(char *)(*in_RDI + (long)(iVar3 + -1)) == '0';
            }
            if (!bVar6) break;
            iVar3 = iVar3 + -1;
          }
          in_stack_ffffffffffffffac = 0;
        }
        if (((iVar5 != 0) || (iVar3 != 0)) ||
           (local_18 = in_RSI + 1, (*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
          in_RSI[1] = (char)in_RDI[4];
          std::fill_n<char*,int,char>
                    ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(char *)CONCAT44(iVar5,iVar3));
          local_18 = copy_str<char,_const_char_*,_char_*,_0>
                               ((char *)in_RDI,
                                (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8)))),(char *)0x156504);
        }
      }
      else {
        pcVar4 = copy_str<char,_const_char_*,_char_*,_0>
                           ((char *)in_RDI,
                            (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                             CONCAT16(in_stack_ffffffffffffffae,
                                                      CONCAT15(in_stack_ffffffffffffffad,
                                                               CONCAT14(in_stack_ffffffffffffffac,
                                                                        in_stack_ffffffffffffffa8)))
                                            ),(char *)0x156291);
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          iVar3 = (int)in_RDI[1];
          while( true ) {
            bVar6 = false;
            if (iVar5 < iVar3) {
              bVar6 = *(char *)(*in_RDI + (long)(iVar3 + -1)) == '0';
            }
            if (!bVar6) break;
            iVar3 = iVar3 + -1;
          }
          if (iVar3 != iVar5) {
            *pcVar4 = (char)in_RDI[4];
          }
          pcVar4 = copy_str<char,_const_char_*,_char_*,_0>
                             ((char *)in_RDI,
                              (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        (uint6)CONCAT14(in_stack_ffffffffffffffac,
                                                                        in_stack_ffffffffffffffa8)))
                              ,(char *)0x15634f);
          return pcVar4;
        }
        *pcVar4 = (char)in_RDI[4];
        local_18 = copy_str<char,_const_char_*,_char_*,_0>
                             ((char *)in_RDI,
                              (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        CONCAT15(in_stack_ffffffffffffffad,
                                                                 CONCAT14(in_stack_ffffffffffffffac,
                                                                          in_stack_ffffffffffffffa8)
                                                                ))),(char *)0x156393);
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_18 = std::fill_n<char*,int,char>
                               ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ),(int)in_RDI[3] - (int)in_RDI[1],
                                (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ));
        }
      }
    }
    else {
      copy_str<char,_const_char_*,_char_*,_0>
                ((char *)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT15(in_stack_ffffffffffffffad,
                                                    CONCAT14(in_stack_ffffffffffffffac,
                                                             in_stack_ffffffffffffffa8)))),
                 (char *)0x156196);
      pcVar4 = std::fill_n<char*,int,char>
                         ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc,
                          (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0) ||
         (local_18 = pcVar4, (int)in_RDI[3] < 0)) {
        *pcVar4 = (char)in_RDI[4];
        if ((int)in_RDI[3] - iVar5 < 1) {
          local_18 = pcVar4 + 1;
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_18 = pcVar4 + 2;
            pcVar4[1] = '0';
          }
          return local_18;
        }
        local_18 = std::fill_n<char*,int,char>
                             ((char *)CONCAT44(CONCAT13(0x30,(int3)in_stack_ffffffffffffffd4),
                                               in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                              (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
        ;
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }